

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O1

string * __thiscall
duckdb::StringType::GetCollation_abi_cxx11_
          (string *__return_storage_ptr__,StringType *this,LogicalType *type)

{
  optional_ptr<duckdb::ExtraTypeInfo,_true> info;
  optional_ptr<duckdb::ExtraTypeInfo,_true> local_18;
  
  if (((*this == (StringType)0x19) &&
      (local_18.ptr = *(ExtraTypeInfo **)(this + 8), local_18.ptr != (ExtraTypeInfo *)0x0)) &&
     (optional_ptr<duckdb::ExtraTypeInfo,_true>::CheckValid(&local_18),
     (local_18.ptr)->type != GENERIC_TYPE_INFO)) {
    optional_ptr<duckdb::ExtraTypeInfo,_true>::CheckValid(&local_18);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_18.ptr[1]._vptr_ExtraTypeInfo,
               *(long *)&local_18.ptr[1].type + (long)local_18.ptr[1]._vptr_ExtraTypeInfo);
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

string StringType::GetCollation(const LogicalType &type) {
	if (type.id() != LogicalTypeId::VARCHAR) {
		return string();
	}
	auto info = type.AuxInfo();
	if (!info) {
		return string();
	}
	if (info->type == ExtraTypeInfoType::GENERIC_TYPE_INFO) {
		return string();
	}
	return info->Cast<StringTypeInfo>().collation;
}